

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O1

void * __thiscall cppnet::BlockMemoryPool::PoolLargeMalloc(BlockMemoryPool *this)

{
  pointer ppvVar1;
  void *pvVar2;
  
  if ((this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (*this->_vptr_BlockMemoryPool[7])(this,0);
  }
  ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pvVar2 = ppvVar1[-1];
  (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppvVar1 + -1;
  return pvVar2;
}

Assistant:

void* BlockMemoryPool::PoolLargeMalloc() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    if (_free_mem_vec.empty()) {
        Expansion();
    }

    void* ret = _free_mem_vec.back();
    _free_mem_vec.pop_back();
    return ret;
}